

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

string * cxx_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  char *cpp;
  allocator local_25 [20];
  allocator local_11;
  char *local_10;
  
  pcVar1 = getenv("CXX");
  local_10 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"clang++",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  return in_RDI;
}

Assistant:

std::string cxx() {
  if (auto cpp = std::getenv("CXX")) {
    return cpp;
  }

#if defined(__CLANG__)
  return "clang++";
#elif defined(__GCC__)
  return "g++";
#elif defined(__MSVC__)
#if defined(__clang__)
  return "clang-cl";
#else
  return "cl";
#endif
#endif
}